

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_bary3(REF_GEOM ref_geom,REF_INT *nodes,REF_DBL *uv,REF_DBL *bary)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  REF_INT sens;
  REF_INT geom2;
  REF_INT geom1;
  REF_INT geom0;
  REF_DBL uv2 [2];
  REF_DBL uv1 [2];
  REF_DBL uv0 [2];
  REF_INT RStack_78;
  int local_74;
  int local_70;
  int local_6c;
  double local_68;
  double local_60;
  REF_DBL local_58;
  REF_DBL local_50;
  REF_DBL local_48;
  REF_DBL local_40;
  
  uVar1 = ref_geom_cell_tuv(ref_geom,*nodes,nodes,2,&local_48,&RStack_78);
  if (uVar1 == 0) {
    uVar1 = ref_geom_cell_tuv(ref_geom,nodes[1],nodes,2,&local_58,&RStack_78);
    if (uVar1 == 0) {
      uVar1 = ref_geom_cell_tuv(ref_geom,nodes[2],nodes,2,&local_68,&RStack_78);
      if (uVar1 == 0) {
        uVar1 = ref_geom_find(ref_geom,*nodes,2,nodes[3],&local_6c);
        if (uVar1 == 0) {
          if (ref_geom->descr[(long)local_6c * 6 + 4] != 0) {
            if (ref_geom->descr[(long)local_6c * 6 + 4] < 1) {
              local_48 = *uv;
            }
            else {
              local_40 = uv[1];
            }
          }
          uVar1 = ref_geom_find(ref_geom,nodes[1],2,nodes[3],&local_70);
          if (uVar1 == 0) {
            if (ref_geom->descr[(long)local_70 * 6 + 4] != 0) {
              if (ref_geom->descr[(long)local_70 * 6 + 4] < 1) {
                local_58 = *uv;
              }
              else {
                local_50 = uv[1];
              }
            }
            uVar1 = ref_geom_find(ref_geom,nodes[2],2,nodes[3],&local_74);
            if (uVar1 == 0) {
              if (ref_geom->descr[(long)local_74 * 6 + 4] != 0) {
                if (ref_geom->descr[(long)local_74 * 6 + 4] < 1) {
                  local_68 = *uv;
                }
                else {
                  local_60 = uv[1];
                }
              }
              dVar3 = local_58 * local_60 +
                      (((*uv * local_50 + (uv[1] * local_68 - local_58 * uv[1])) -
                       local_68 * local_50) - *uv * local_60);
              *bary = dVar3;
              dVar4 = *uv * local_60 +
                      (((local_48 * uv[1] + (local_68 * local_40 - *uv * local_40)) -
                       local_68 * uv[1]) - local_48 * local_60);
              bary[1] = dVar4;
              dVar5 = local_58 * uv[1] +
                      (((local_48 * local_50 + (local_40 * *uv - local_58 * local_40)) -
                       *uv * local_50) - local_48 * uv[1]);
              bary[2] = dVar5;
              dVar2 = dVar3 + dVar4 + dVar5;
              dVar6 = dVar2 * 1e+20;
              if (dVar6 <= -dVar6) {
                dVar6 = -dVar6;
              }
              dVar7 = dVar3;
              if (dVar3 <= -dVar3) {
                dVar7 = -dVar3;
              }
              if (dVar7 < dVar6) {
                dVar7 = dVar4;
                if (dVar4 <= -dVar4) {
                  dVar7 = -dVar4;
                }
                if (dVar7 < dVar6) {
                  dVar7 = dVar5;
                  if (dVar5 <= -dVar5) {
                    dVar7 = -dVar5;
                  }
                  if (dVar7 < dVar6) {
                    *bary = dVar3 / dVar2;
                    bary[1] = dVar4 / dVar2;
                    bary[2] = dVar5 / dVar2;
                    return 0;
                  }
                }
              }
              printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e %.18e\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xf4f,"ref_geom_bary3");
              *bary = 0.0;
              bary[1] = 0.0;
              bary[2] = 0.0;
              uVar1 = 4;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xf34,"ref_geom_bary3",(ulong)uVar1,"g2");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xf2b,"ref_geom_bary3",(ulong)uVar1,"g1");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xf22,"ref_geom_bary3",(ulong)uVar1,"g0");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xf20,"ref_geom_bary3",(ulong)uVar1,"uv2");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf1e,
             "ref_geom_bary3",(ulong)uVar1,"uv1");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf1c,
           "ref_geom_bary3",(ulong)uVar1,"uv0");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bary3(REF_GEOM ref_geom, REF_INT *nodes,
                                  REF_DBL *uv, REF_DBL *bary) {
  REF_DBL uv0[2], uv1[2], uv2[2];
  REF_INT sens;
  REF_DBL total;
  REF_INT geom0, geom1, geom2;
  RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_FACE, uv0, &sens),
      "uv0");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_FACE, uv1, &sens),
      "uv1");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[2], nodes, REF_GEOM_FACE, uv2, &sens),
      "uv2");

  RSS(ref_geom_find(ref_geom, nodes[0], REF_GEOM_FACE, nodes[3], &geom0), "g0");
  if (0 != ref_geom_degen(ref_geom, geom0)) {
    if (0 < ref_geom_degen(ref_geom, geom0)) {
      uv0[1] = uv[1];
    } else {
      uv0[0] = uv[0];
    }
  }

  RSS(ref_geom_find(ref_geom, nodes[1], REF_GEOM_FACE, nodes[3], &geom1), "g1");
  if (0 != ref_geom_degen(ref_geom, geom1)) {
    if (0 < ref_geom_degen(ref_geom, geom1)) {
      uv1[1] = uv[1];
    } else {
      uv1[0] = uv[0];
    }
  }

  RSS(ref_geom_find(ref_geom, nodes[2], REF_GEOM_FACE, nodes[3], &geom2), "g2");
  if (0 != ref_geom_degen(ref_geom, geom2)) {
    if (0 < ref_geom_degen(ref_geom, geom2)) {
      uv2[1] = uv[1];
    } else {
      uv2[0] = uv[0];
    }
  }

  bary[0] = -uv1[0] * uv[1] + uv2[0] * uv[1] + uv[0] * uv1[1] -
            uv2[0] * uv1[1] - uv[0] * uv2[1] + uv1[0] * uv2[1];
  bary[1] = -uv[0] * uv0[1] + uv2[0] * uv0[1] + uv0[0] * uv[1] -
            uv2[0] * uv[1] - uv0[0] * uv2[1] + uv[0] * uv2[1];
  bary[2] = -uv1[0] * uv0[1] + uv[0] * uv0[1] + uv0[0] * uv1[1] -
            uv[0] * uv1[1] - uv0[0] * uv[1] + uv1[0] * uv[1];

  total = bary[0] + bary[1] + bary[2];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
  } else {
    REF_INT i;
    printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e %.18e\n",
           __FILE__, __LINE__, __func__, total, bary[0], bary[1], bary[2]);
    for (i = 0; i < 3; i++) bary[i] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}